

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_queue.h
# Opt level: O2

optional<int> __thiscall
density::
function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
::try_consume_impl(function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                   *this,heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
                         *param_2)

{
  int iVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_()> *pFVar2;
  void *pvVar3;
  consume_operation cons;
  consume_operation local_30;
  
  local_30.m_control =
       heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
       ::start_consume_impl(param_2);
  local_30.m_queue = param_2;
  if (local_30.m_control == (ControlBlock *)0x0) {
    (this->m_queue).m_head = (ControlBlock *)0x0;
  }
  else {
    pFVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::complete_type(&local_30);
    pvVar3 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::unaligned_element_ptr(&local_30);
    iVar1 = (*pFVar2->m_align_invoke_destroy)(pvVar3);
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
    ::consume_operation::commit_nodestroy(&local_30);
    *(undefined1 *)((long)&(this->m_queue).m_head + 4) = 1;
    *(int *)&(this->m_queue).m_head = iVar1;
  }
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation(&local_30);
  return (optional<int>)this;
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }